

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_header.hpp
# Opt level: O2

bool __thiscall
ELFIO::elf_header_impl<ELFIO::Elf32_Ehdr>::save
          (elf_header_impl<ELFIO::Elf32_Ehdr> *this,ostream *stream)

{
  streampos sVar1;
  
  sVar1 = address_translator::operator[](this->translator,(streampos)ZEXT816(0));
  std::ostream::seekp(stream,sVar1._M_off,sVar1._M_state);
  std::ostream::write((char *)stream,(long)&this->header);
  return *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0;
}

Assistant:

bool save( std::ostream& stream ) const override
    {
        stream.seekp( ( *translator )[0] );
        stream.write( reinterpret_cast<const char*>( &header ),
                      sizeof( header ) );

        return stream.good();
    }